

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

size_t __thiscall
OpenMesh::PropertyT<unsigned_int>::store(PropertyT<unsigned_int> *this,ostream *_ostr,bool _swap)

{
  size_t sVar1;
  
  sVar1 = IO::binary<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::store
                    (_ostr,&this->data_,_swap);
  return sVar1;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }